

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::Utils::getStringForVariableTypeValue_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,_variable_type type,uchar *data_ptr)

{
  TestError *this_00;
  undefined4 in_register_00000014;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  undefined1 local_198 [376];
  double *local_20;
  uchar *data_ptr_local;
  string *psStack_10;
  _variable_type type_local;
  
  local_20 = (double *)CONCAT44(in_register_00000014,type);
  data_ptr_local._4_4_ = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  switch(data_ptr_local._4_4_) {
  case 0:
    std::ostream::operator<<(local_198,(bool)(*(byte *)local_20 & 1));
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized variable type requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x4de);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 4:
    std::ostream::operator<<(local_198,*local_20);
    break;
  case 0x11:
    std::ostream::operator<<(local_198,*(float *)local_20);
    break;
  case 0x12:
    std::ostream::operator<<(local_198,(int)*(float *)local_20);
    break;
  case 0x1f:
    std::ostream::operator<<(local_198,(uint)*(float *)local_20);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getStringForVariableTypeValue(_variable_type type, const unsigned char* data_ptr)
{
	std::stringstream result_sstream;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result_sstream << *((bool*)data_ptr);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result_sstream << *((double*)data_ptr);
		break;
	case VARIABLE_TYPE_FLOAT:
		result_sstream << *((float*)data_ptr);
		break;
	case VARIABLE_TYPE_INT:
		result_sstream << *((int*)data_ptr);
		break;
	case VARIABLE_TYPE_UINT:
		result_sstream << *((unsigned int*)data_ptr);
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type requested");
	}
	} /* switch (type) */

	return result_sstream.str();
}